

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VList * sqlite3VListAdd(sqlite3 *db,VList *pIn,char *zName,int nName,int iVal)

{
  int iVar1;
  int iVar2;
  long local_60;
  VList *pOut;
  sqlite3_int64 nAlloc;
  int i;
  char *z;
  int nInt;
  int iVal_local;
  int nName_local;
  char *zName_local;
  VList *pIn_local;
  sqlite3 *db_local;
  
  iVar2 = nName / 4 + 3;
  if ((pIn == (VList *)0x0) || (zName_local = (char *)pIn, *pIn < pIn[1] + iVar2)) {
    if (pIn == (VList *)0x0) {
      local_60 = 10;
    }
    else {
      local_60 = (long)*pIn << 1;
    }
    zName_local = (char *)sqlite3DbRealloc(db,pIn,(local_60 + iVar2) * 4);
    if (zName_local == (char *)0x0) {
      return pIn;
    }
    if (pIn == (VList *)0x0) {
      zName_local[4] = '\x02';
      zName_local[5] = '\0';
      zName_local[6] = '\0';
      zName_local[7] = '\0';
    }
    *(int *)zName_local = (int)(local_60 + iVar2);
  }
  iVar1 = *(int *)(zName_local + 4);
  *(int *)(zName_local + (long)iVar1 * 4) = iVal;
  *(int *)(zName_local + (long)(iVar1 + 1) * 4) = iVar2;
  *(int *)(zName_local + 4) = iVar1 + iVar2;
  memcpy(zName_local + (long)(iVar1 + 2) * 4,zName,(long)nName);
  (zName_local + (long)(iVar1 + 2) * 4)[nName] = '\0';
  return (VList *)zName_local;
}

Assistant:

SQLITE_PRIVATE VList *sqlite3VListAdd(
  sqlite3 *db,           /* The database connection used for malloc() */
  VList *pIn,            /* The input VList.  Might be NULL */
  const char *zName,     /* Name of symbol to add */
  int nName,             /* Bytes of text in zName */
  int iVal               /* Value to associate with zName */
){
  int nInt;              /* number of sizeof(int) objects needed for zName */
  char *z;               /* Pointer to where zName will be stored */
  int i;                 /* Index in pIn[] where zName is stored */

  nInt = nName/4 + 3;
  assert( pIn==0 || pIn[0]>=3 );  /* Verify ok to add new elements */
  if( pIn==0 || pIn[1]+nInt > pIn[0] ){
    /* Enlarge the allocation */
    sqlite3_int64 nAlloc = (pIn ? 2*(sqlite3_int64)pIn[0] : 10) + nInt;
    VList *pOut = sqlite3DbRealloc(db, pIn, nAlloc*sizeof(int));
    if( pOut==0 ) return pIn;
    if( pIn==0 ) pOut[1] = 2;
    pIn = pOut;
    pIn[0] = nAlloc;
  }
  i = pIn[1];
  pIn[i] = iVal;
  pIn[i+1] = nInt;
  z = (char*)&pIn[i+2];
  pIn[1] = i+nInt;
  assert( pIn[1]<=pIn[0] );
  memcpy(z, zName, nName);
  z[nName] = 0;
  return pIn;
}